

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplaceRealloc<slang::ast::GenerateBlockSymbol_const&,int&>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,pointer pos,
          GenerateBlockSymbol *args,int *args_1)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pEVar4;
  long lVar5;
  pointer pEVar6;
  iterator pEVar7;
  iterator in_RSI;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Element *in_stack_ffffffffffffff90;
  Symbol *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa0;
  iterator this_00;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_stack_ffffffffffffffa8;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)0x720e70);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = in_RSI;
  pEVar4 = begin(in_RDI);
  lVar5 = (long)this_00 - (long)pEVar4;
  pEVar6 = (pointer)operator_new(0x720ecf);
  ast::HierarchicalReference::Element::Element
            (this_00,in_stack_ffffffffffffff98,(int32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  pEVar4 = in_RSI;
  pEVar7 = end(in_RDI);
  if (pEVar4 == pEVar7) {
    pEVar7 = begin(in_RDI);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::HierarchicalReference::Element*,slang::ast::HierarchicalReference::Element*>
              (this_00,pEVar7,in_stack_ffffffffffffff90);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::HierarchicalReference::Element*,slang::ast::HierarchicalReference::Element*>
              (this_00,(Element *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::HierarchicalReference::Element*,slang::ast::HierarchicalReference::Element*>
              (this_00,(Element *)in_stack_ffffffffffffff98,in_RSI);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pEVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pEVar6;
  return pEVar6 + (lVar5 >> 5);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}